

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void bitwise_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int local_3c;
  int local_38;
  int local_34;
  int i;
  int *accum_aux_local;
  int *accum_local;
  int *auxs_local;
  int *vals_local;
  int n_local;
  
  if (n < 1) {
    local_38 = 0x7ffffffe;
  }
  else {
    local_38 = *vals;
  }
  *accum = local_38;
  for (local_34 = 1; local_34 < n; local_34 = local_34 + 1) {
    bitwise_or_combine_accum_help(vals[local_34],accum);
  }
  if (n < 1) {
    local_3c = 0x7ffffffe;
  }
  else {
    local_3c = *auxs;
  }
  *accum_aux = local_3c;
  for (local_34 = 1; local_34 < n; local_34 = local_34 + 1) {
    bitwise_or_combine_accum_help(auxs[local_34],accum_aux);
  }
  return;
}

Assistant:

static void bitwise_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(auxs[i], accum_aux);
	}
}